

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::ValidateMapEntry
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  Descriptor *pDVar5;
  Descriptor *pDVar6;
  EnumDescriptor *this_00;
  EnumValueDescriptor *this_01;
  AlphaNum *b;
  undefined1 in_R8B;
  bool bVar7;
  string_view sVar8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_170;
  basic_string_view<char,_std::char_traits<char>_> local_160;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_150;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  FieldDescriptor *local_130;
  FieldDescriptor *value;
  FieldDescriptor *key;
  AlphaNum local_118;
  byte local_d1;
  string_view local_d0;
  string local_c0;
  AlphaNum local_a0;
  string local_70;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_50;
  string_view local_40;
  Descriptor *local_30;
  Descriptor *message;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  
  message = (Descriptor *)proto;
  proto_local = (FieldDescriptorProto *)field;
  field_local = (FieldDescriptor *)this;
  local_30 = FieldDescriptor::message_type(field);
  iVar3 = Descriptor::extension_count(local_30);
  _Var1._M_str = local_50._M_str;
  _Var1._M_len = local_50._M_len;
  local_d1 = 0;
  key._7_1_ = 0;
  bVar7 = true;
  if ((iVar3 == 0) &&
     (bVar7 = true, local_50 = _Var1,
     *(byte *)((long)&(proto_local->super_Message).super_MessageLite._vptr_MessageLite + 1) >> 6 ==
     3)) {
    iVar3 = Descriptor::extension_range_count(local_30);
    bVar7 = true;
    if (iVar3 == 0) {
      iVar3 = Descriptor::nested_type_count(local_30);
      bVar7 = true;
      if (iVar3 == 0) {
        iVar3 = Descriptor::enum_type_count(local_30);
        bVar7 = true;
        if (iVar3 == 0) {
          iVar3 = Descriptor::field_count(local_30);
          bVar7 = true;
          if (iVar3 == 2) {
            local_40 = Descriptor::name(local_30);
            local_d0 = FieldDescriptor::name((FieldDescriptor *)proto_local);
            b = (AlphaNum *)0x0;
            sVar8._M_str = (char *)0x0;
            sVar8._M_len = (size_t)local_d0._M_str;
            protobuf::(anonymous_namespace)::ToCamelCase_abi_cxx11_
                      (&local_c0,(_anonymous_namespace_ *)local_d0._M_len,sVar8,(bool)in_R8B);
            local_d1 = 1;
            absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_a0,&local_c0);
            absl::lts_20250127::AlphaNum::AlphaNum(&local_118,"Entry");
            absl::lts_20250127::StrCat_abi_cxx11_(&local_70,(lts_20250127 *)&local_a0,&local_118,b);
            key._7_1_ = 1;
            local_50 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                       std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_70)
            ;
            bVar2 = std::operator!=(local_40,local_50);
            bVar7 = true;
            if (!bVar2) {
              pDVar5 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
              pDVar6 = Descriptor::containing_type(local_30);
              bVar7 = pDVar5 != pDVar6;
            }
          }
        }
      }
    }
  }
  if ((key._7_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((local_d1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c0);
  }
  if (bVar7) {
    return false;
  }
  value = Descriptor::map_key(local_30);
  local_130 = Descriptor::map_value(local_30);
  if ((byte)value->field_0x1 >> 6 != 1) {
    return false;
  }
  iVar3 = FieldDescriptor::number(value);
  if (iVar3 != 1) {
    return false;
  }
  local_140 = FieldDescriptor::name(value);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_150,"key");
  bVar7 = std::operator!=(local_140,local_150);
  if (bVar7) {
    return false;
  }
  if ((byte)local_130->field_0x1 >> 6 != 1) {
    return false;
  }
  iVar3 = FieldDescriptor::number(local_130);
  if (iVar3 != 2) {
    return false;
  }
  local_160 = FieldDescriptor::name(local_130);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_170,"value");
  bVar7 = std::operator!=(local_160,local_170);
  if (bVar7) {
    return false;
  }
  TVar4 = FieldDescriptor::type(value);
  if (1 < TVar4 - TYPE_DOUBLE) {
    if (TVar4 - TYPE_INT64 < 7) goto LAB_005e4196;
    if (2 < TVar4 - TYPE_GROUP) {
      if ((TVar4 != TYPE_UINT32) && (TVar4 == TYPE_ENUM)) {
        sVar8 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
        AddError(this,sVar8,(Message *)message,TYPE,"Key in map fields cannot be enum types.");
      }
      goto LAB_005e4196;
    }
  }
  sVar8 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
  AddError(this,sVar8,(Message *)message,TYPE,
           "Key in map fields cannot be float/double, bytes or message types.");
LAB_005e4196:
  TVar4 = FieldDescriptor::type(local_130);
  if (TVar4 == TYPE_ENUM) {
    this_00 = FieldDescriptor::enum_type(local_130);
    this_01 = EnumDescriptor::value(this_00,0);
    iVar3 = EnumValueDescriptor::number(this_01);
    if (iVar3 != 0) {
      sVar8 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
      AddError(this,sVar8,(Message *)message,TYPE,
               "Enum value in map must define 0 as the first value.");
    }
  }
  return true;
}

Assistant:

bool DescriptorBuilder::ValidateMapEntry(const FieldDescriptor* field,
                                         const FieldDescriptorProto& proto) {
  const Descriptor* message = field->message_type();
  if (  // Must not contain extensions, extension range or nested message or
        // enums
      message->extension_count() != 0 ||
      field->label_ != FieldDescriptor::LABEL_REPEATED ||
      message->extension_range_count() != 0 ||
      message->nested_type_count() != 0 || message->enum_type_count() != 0 ||
      // Must contain exactly two fields
      message->field_count() != 2 ||
      // Field name and message name must match
      message->name() !=
          absl::StrCat(ToCamelCase(field->name(), false), "Entry") ||
      // Entry message must be in the same containing type of the field.
      field->containing_type() != message->containing_type()) {
    return false;
  }

  const FieldDescriptor* key = message->map_key();
  const FieldDescriptor* value = message->map_value();
  if (key->label_ != FieldDescriptor::LABEL_OPTIONAL || key->number() != 1 ||
      key->name() != "key") {
    return false;
  }
  if (value->label_ != FieldDescriptor::LABEL_OPTIONAL ||
      value->number() != 2 || value->name() != "value") {
    return false;
  }

  // Check key types are legal.
  switch (key->type()) {
    case FieldDescriptor::TYPE_ENUM:
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Key in map fields cannot be enum types.");
      break;
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_BYTES:
      AddError(
          field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
          "Key in map fields cannot be float/double, bytes or message types.");
      break;
    case FieldDescriptor::TYPE_BOOL:
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SFIXED64:
      // Legal cases
      break;
      // Do not add a default, so that the compiler will complain when new types
      // are added.
  }

  if (value->type() == FieldDescriptor::TYPE_ENUM) {
    if (value->enum_type()->value(0)->number() != 0) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Enum value in map must define 0 as the first value.");
    }
  }

  return true;
}